

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multistream.h
# Opt level: O2

void __thiscall ipx::Multistream::~Multistream(Multistream *this)

{
  ~Multistream(this);
  operator_delete(this);
  return;
}

Assistant:

Multistream() : std::ostream(nullptr) {
        std::ostream::rdbuf(&mbuffer_);
    }